

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O0

void cpu_exec_nocache(CPUState *cpu,int max_cycles,TranslationBlock *orig_tb,_Bool ignore_icount)

{
  TranslationBlock *itb;
  uint local_38;
  uint local_34;
  uint32_t cflags;
  TranslationBlock *tb;
  _Bool ignore_icount_local;
  TranslationBlock *orig_tb_local;
  int max_cycles_local;
  CPUState *cpu_local;
  
  local_34 = curr_cflags();
  if (ignore_icount) {
    local_34 = local_34 & 0xfffdffff;
  }
  local_34 = local_34 | 0x10000;
  local_38 = max_cycles;
  if (0x7ffe < max_cycles) {
    local_38 = 0x7fff;
  }
  mmap_lock();
  itb = (TranslationBlock *)
        tb_gen_code_tricore(cpu,(target_ulong_conflict)orig_tb->pc,
                            *(target_ulong_conflict *)((long)&orig_tb->pc + 4),
                            (uint32_t)orig_tb->cs_base,local_38 | local_34);
  (itb->tc).size = (size_t)orig_tb;
  mmap_unlock();
  cpu_tb_exec(cpu,itb);
  mmap_lock();
  tb_phys_invalidate_tricore
            ((TCGContext_conflict9 *)cpu->uc->tcg_ctx,(TranslationBlock_conflict *)itb,
             0xffffffffffffffff);
  mmap_unlock();
  tcg_tb_remove_tricore((TCGContext_conflict9 *)cpu->uc->tcg_ctx,(TranslationBlock_conflict *)itb);
  return;
}

Assistant:

static void cpu_exec_nocache(CPUState *cpu, int max_cycles,
                             TranslationBlock *orig_tb, bool ignore_icount)
{
    TranslationBlock *tb;
    uint32_t cflags = curr_cflags() | CF_NOCACHE;

    if (ignore_icount) {
        cflags &= ~CF_USE_ICOUNT;
    }

    /* Should never happen.
       We only end up here when an existing TB is too long.  */
    cflags |= MIN(max_cycles, CF_COUNT_MASK);

    mmap_lock();
    tb = tb_gen_code(cpu, orig_tb->pc, orig_tb->cs_base,
                     orig_tb->flags, cflags);
    tb->orig_tb = orig_tb;
    mmap_unlock();

    /* execute the generated code */
    cpu_tb_exec(cpu, tb);

    mmap_lock();
    tb_phys_invalidate(cpu->uc->tcg_ctx, tb, -1);
    mmap_unlock();
    tcg_tb_remove(cpu->uc->tcg_ctx, tb);
}